

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

bool NeedIoC(void)

{
  int iVar1;
  
  SkipBlanks();
  if (((*lp == '(') && (iVar1 = tolower((uint)(byte)lp[1]), iVar1 == 99)) && (lp[2] == ')')) {
    lp = lp + 3;
    return true;
  }
  return false;
}

Assistant:

bool NeedIoC() {
	SkipBlanks();
	if ('(' != lp[0] || 'c' != tolower((byte)lp[1]) || ')' != lp[2]) return false;
	lp += 3;
	return true;
}